

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_> * __thiscall
minja::Parser::parseIfExpression
          (pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>
           *__return_storage_ptr__,Parser *this)

{
  CharIterator CVar1;
  int iVar2;
  runtime_error *prVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_48 [24];
  CharIterator local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  parseLogicalOr((Parser *)local_48);
  if ((element_type *)local_48._0_8_ == (element_type *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Expected condition expression");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (parseIfExpression()::else_tok_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parseIfExpression()::else_tok_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseIfExpression()::else_tok_abi_cxx11_,"else\\b",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseIfExpression()::else_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseIfExpression()::else_tok_abi_cxx11_);
    }
  }
  consumeToken((string *)(local_48 + 0x10),this,&parseIfExpression()::else_tok_abi_cxx11_,Strip);
  CVar1._M_current = local_30._M_current;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._16_8_ != &local_28) {
    operator_delete((void *)local_48._16_8_,(ulong)(local_28._M_allocated_capacity + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar1._M_current ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_30._M_current = (char *)0x0;
  }
  else {
    parseExpression((Parser *)(local_48 + 0x10),SUB81(this,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._16_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Expected \'else\' expression");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  (__return_storage_ptr__->first).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_48._0_8_;
  (__return_storage_ptr__->first).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
  (__return_storage_ptr__->second).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_48._16_8_;
  (__return_storage_ptr__->second).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_current;
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<Expression>, std::shared_ptr<Expression>> parseIfExpression() {
        auto condition = parseLogicalOr();
        if (!condition) throw std::runtime_error("Expected condition expression");

        static std::regex else_tok(R"(else\b)");
        std::shared_ptr<Expression> else_expr;
        if (!consumeToken(else_tok).empty()) {
          else_expr = parseExpression();
          if (!else_expr) throw std::runtime_error("Expected 'else' expression");
        }
        return std::pair(std::move(condition), std::move(else_expr));
    }